

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void template_notifyforscalar
               (t_template *template,_glist *owner,t_scalar *sc,t_symbol *s,int argc,t_atom *argv)

{
  t_gpointer gp;
  t_gpointer local_48;
  
  gpointer_init(&local_48);
  gpointer_setglist(&local_48,owner,sc);
  argv->a_type = A_POINTER;
  (argv->a_w).w_gpointer = &local_48;
  if (template->t_list != (_gtemplate *)0x0) {
    outlet_anything((template->t_list->x_obj).te_outlet,s,argc,argv);
  }
  gpointer_unset(&local_48);
  return;
}

Assistant:

void template_notifyforscalar(t_template *template, t_glist *owner,
    t_scalar *sc, t_symbol *s, int argc, t_atom *argv)
{
    t_gpointer gp;
    gpointer_init(&gp);
    gpointer_setglist(&gp, owner, sc);
    SETPOINTER(argv, &gp);
    template_notify(template, s, argc, argv);
    gpointer_unset(&gp);
}